

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

ArrayBuilder<capnp::compiler::BrandScope_*> * __thiscall
kj::ArrayBuilder<capnp::compiler::BrandScope_*>::operator=
          (ArrayBuilder<capnp::compiler::BrandScope_*> *this,
          ArrayBuilder<capnp::compiler::BrandScope_*> *other)

{
  BrandScope **ppBVar1;
  RemoveConst<capnp::compiler::BrandScope_*> *ppBVar2;
  BrandScope **ppBVar3;
  ArrayDisposer *pAVar4;
  
  ppBVar1 = this->ptr;
  if (ppBVar1 != (BrandScope **)0x0) {
    ppBVar2 = this->pos;
    ppBVar3 = this->endPtr;
    this->ptr = (BrandScope **)0x0;
    this->pos = (RemoveConst<capnp::compiler::BrandScope_*> *)0x0;
    this->endPtr = (BrandScope **)0x0;
    (*(code *)**(undefined8 **)this->disposer)
              (this->disposer,ppBVar1,8,(long)ppBVar2 - (long)ppBVar1 >> 3,
               (long)ppBVar3 - (long)ppBVar1 >> 3,0);
  }
  ppBVar2 = other->pos;
  this->ptr = other->ptr;
  this->pos = ppBVar2;
  pAVar4 = other->disposer;
  this->endPtr = other->endPtr;
  this->disposer = pAVar4;
  other->ptr = (BrandScope **)0x0;
  other->pos = (RemoveConst<capnp::compiler::BrandScope_*> *)0x0;
  other->endPtr = (BrandScope **)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }